

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Edg_ManEvalEdgeDelay(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int local_1c;
  int DelayMax;
  int Delay;
  int iLut;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    if (p->vEdgeDelay == (Vec_Int_t *)0x0) {
      iVar1 = Gia_ManObjNum(p);
      pVVar2 = Vec_IntStart(iVar1);
      p->vEdgeDelay = pVVar2;
    }
    else {
      pVVar2 = p->vEdgeDelay;
      iVar1 = Gia_ManObjNum(p);
      Vec_IntFill(pVVar2,iVar1,0);
    }
    for (DelayMax = 1; iVar1 = Gia_ManObjNum(p), DelayMax < iVar1; DelayMax = DelayMax + 1) {
      iVar1 = Gia_ObjIsLut2(p,DelayMax);
      if (iVar1 != 0) {
        iVar1 = Edg_ObjEvalEdgeDelay(p,DelayMax,p->vEdgeDelay);
        Vec_IntWriteEntry(p->vEdgeDelay,DelayMax,iVar1);
        local_1c = Abc_MaxInt(local_1c,iVar1);
      }
    }
    return local_1c;
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x2c0,"int Edg_ManEvalEdgeDelay(Gia_Man_t *)");
}

Assistant:

int Edg_ManEvalEdgeDelay( Gia_Man_t * p )
{
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelay == NULL )
        p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelay, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelay(p, iLut, p->vEdgeDelay);
        Vec_IntWriteEntry( p->vEdgeDelay, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}